

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockMultiNestedStructCase::init
          (BlockMultiNestedStructCase *this,EVP_PKEY_CTX *ctx)

{
  StructType *pSVar1;
  BufferBlock *pBVar2;
  BlockMultiNestedStructCase *extraout_RAX;
  VarType local_350;
  BufferVar local_338;
  VarType local_2f8;
  BufferVar local_2e0;
  VarType local_2a0;
  BufferVar local_288;
  VarType local_248;
  BufferVar local_230;
  BufferBlock *local_1f0;
  BufferBlock *blockB;
  BufferVar local_1d0;
  VarType local_190;
  BufferVar local_178;
  VarType local_138;
  BufferVar local_120;
  BufferBlock *local_e0;
  BufferBlock *blockA;
  VarType local_c0;
  VarType local_a8;
  StructType *local_90;
  StructType *typeT;
  VarType local_70;
  VarType local_58;
  VarType local_30;
  StructType *local_18;
  StructType *typeS;
  BlockMultiNestedStructCase *this_local;
  
  typeS = (StructType *)this;
  pSVar1 = bb::ShaderInterface::allocStruct(&(this->super_SSBOLayoutCase).m_interface,"S");
  local_18 = pSVar1;
  glu::VarType::VarType(&local_30,TYPE_FLOAT_MAT3,PRECISION_LOWP);
  glu::StructType::addMember(pSVar1,"a",&local_30);
  glu::VarType::~VarType(&local_30);
  pSVar1 = local_18;
  glu::VarType::VarType(&local_70,TYPE_INT_VEC2,PRECISION_MEDIUMP);
  glu::VarType::VarType(&local_58,&local_70,4);
  glu::StructType::addMember(pSVar1,"b",&local_58);
  glu::VarType::~VarType(&local_58);
  glu::VarType::~VarType(&local_70);
  pSVar1 = local_18;
  glu::VarType::VarType((VarType *)&typeT,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar1,"c",(VarType *)&typeT);
  glu::VarType::~VarType((VarType *)&typeT);
  pSVar1 = bb::ShaderInterface::allocStruct(&(this->super_SSBOLayoutCase).m_interface,"T");
  local_90 = pSVar1;
  glu::VarType::VarType(&local_a8,TYPE_UINT,PRECISION_MEDIUMP);
  glu::StructType::addMember(pSVar1,"a",&local_a8);
  glu::VarType::~VarType(&local_a8);
  pSVar1 = local_90;
  glu::VarType::VarType(&local_c0,local_18);
  glu::StructType::addMember(pSVar1,"b",&local_c0);
  glu::VarType::~VarType(&local_c0);
  pSVar1 = local_90;
  glu::VarType::VarType((VarType *)&blockA,TYPE_BOOL_VEC4,PRECISION_LAST);
  glu::StructType::addMember(pSVar1,"c",(VarType *)&blockA);
  glu::VarType::~VarType((VarType *)&blockA);
  pBVar2 = bb::ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"BlockA");
  local_e0 = pBVar2;
  glu::VarType::VarType(&local_138,TYPE_FLOAT,PRECISION_HIGHP);
  bb::BufferVar::BufferVar(&local_120,"a",&local_138,0x1800);
  bb::BufferBlock::addMember(pBVar2,&local_120);
  bb::BufferVar::~BufferVar(&local_120);
  glu::VarType::~VarType(&local_138);
  pBVar2 = local_e0;
  glu::VarType::VarType(&local_190,local_18);
  bb::BufferVar::BufferVar(&local_178,"b",&local_190,0x1000);
  bb::BufferBlock::addMember(pBVar2,&local_178);
  bb::BufferVar::~BufferVar(&local_178);
  glu::VarType::~VarType(&local_190);
  pBVar2 = local_e0;
  glu::VarType::VarType((VarType *)&blockB,TYPE_UINT_VEC3,PRECISION_LOWP);
  bb::BufferVar::BufferVar(&local_1d0,"c",(VarType *)&blockB,0);
  bb::BufferBlock::addMember(pBVar2,&local_1d0);
  bb::BufferVar::~BufferVar(&local_1d0);
  glu::VarType::~VarType((VarType *)&blockB);
  bb::BufferBlock::setInstanceName(local_e0,"blockA");
  bb::BufferBlock::setFlags(local_e0,this->m_flagsA);
  pBVar2 = bb::ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"BlockB");
  local_1f0 = pBVar2;
  glu::VarType::VarType(&local_248,TYPE_FLOAT_MAT2,PRECISION_MEDIUMP);
  bb::BufferVar::BufferVar(&local_230,"a",&local_248,0x1000);
  bb::BufferBlock::addMember(pBVar2,&local_230);
  bb::BufferVar::~BufferVar(&local_230);
  glu::VarType::~VarType(&local_248);
  pBVar2 = local_1f0;
  glu::VarType::VarType(&local_2a0,local_90);
  bb::BufferVar::BufferVar(&local_288,"b",&local_2a0,0x1800);
  bb::BufferBlock::addMember(pBVar2,&local_288);
  bb::BufferVar::~BufferVar(&local_288);
  glu::VarType::~VarType(&local_2a0);
  pBVar2 = local_1f0;
  glu::VarType::VarType(&local_2f8,TYPE_BOOL_VEC4,PRECISION_LAST);
  bb::BufferVar::BufferVar(&local_2e0,"c",&local_2f8,0);
  bb::BufferBlock::addMember(pBVar2,&local_2e0);
  bb::BufferVar::~BufferVar(&local_2e0);
  glu::VarType::~VarType(&local_2f8);
  pBVar2 = local_1f0;
  glu::VarType::VarType(&local_350,TYPE_BOOL,PRECISION_LAST);
  bb::BufferVar::BufferVar(&local_338,"d",&local_350,0x1800);
  bb::BufferBlock::addMember(pBVar2,&local_338);
  bb::BufferVar::~BufferVar(&local_338);
  glu::VarType::~VarType(&local_350);
  bb::BufferBlock::setInstanceName(local_1f0,"blockB");
  bb::BufferBlock::setFlags(local_1f0,this->m_flagsB);
  if (0 < this->m_numInstances) {
    bb::BufferBlock::setArraySize(local_e0,this->m_numInstances);
    bb::BufferBlock::setArraySize(local_1f0,this->m_numInstances);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void init (void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_FLOAT_MAT3, glu::PRECISION_LOWP));
		typeS.addMember("b", VarType(VarType(glu::TYPE_INT_VEC2, glu::PRECISION_MEDIUMP), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_UINT, glu::PRECISION_MEDIUMP)); // \todo [pyry] UNUSED
		typeT.addMember("b", VarType(&typeS));
		typeT.addMember("c", VarType(glu::TYPE_BOOL_VEC4, glu::PRECISION_LAST));

		BufferBlock& blockA = m_interface.allocBlock("BlockA");
		blockA.addMember(BufferVar("a", VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), ACCESS_READ|ACCESS_WRITE));
		blockA.addMember(BufferVar("b", VarType(&typeS), ACCESS_WRITE));
		blockA.addMember(BufferVar("c", VarType(glu::TYPE_UINT_VEC3, glu::PRECISION_LOWP), 0 /* no access */));
		blockA.setInstanceName("blockA");
		blockA.setFlags(m_flagsA);

		BufferBlock& blockB = m_interface.allocBlock("BlockB");
		blockB.addMember(BufferVar("a", VarType(glu::TYPE_FLOAT_MAT2, glu::PRECISION_MEDIUMP), ACCESS_WRITE));
		blockB.addMember(BufferVar("b", VarType(&typeT), ACCESS_READ|ACCESS_WRITE));
		blockB.addMember(BufferVar("c", VarType(glu::TYPE_BOOL_VEC4, glu::PRECISION_LAST), 0 /* no access */));
		blockB.addMember(BufferVar("d", VarType(glu::TYPE_BOOL, glu::PRECISION_LAST), ACCESS_READ|ACCESS_WRITE));
		blockB.setInstanceName("blockB");
		blockB.setFlags(m_flagsB);

		if (m_numInstances > 0)
		{
			blockA.setArraySize(m_numInstances);
			blockB.setArraySize(m_numInstances);
		}
	}